

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::converter::ConvertFieldMaskPath
          (string *__return_storage_ptr__,converter *this,StringPiece path,
          ConverterCallback *converter)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  char *i;
  bool bVar4;
  int iVar5;
  StringPiece local_90;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  stringpiece_ssize_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 local_50 [8];
  StringPiece path_local;
  
  local_60 = path.length_;
  path_local.ptr_ = path.ptr_;
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50 = (undefined1  [8])this;
  path_local.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  i = (char *)0x0;
  iVar5 = 0;
  bVar2 = false;
  bVar4 = false;
  do {
    if (bVar4) {
      if (i == path_local.ptr_) {
        return __return_storage_ptr__;
      }
      StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
        if (cVar1 == '\\') {
          bVar2 = true;
          __return_storage_ptr__ = (string *)path_local.length_;
        }
        else {
          cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
          __return_storage_ptr__ = (string *)path_local.length_;
          if (cVar1 == '\"') {
            iVar5 = (int)i + 1;
            bVar4 = false;
          }
        }
      }
    }
    else {
      if ((((i == path_local.ptr_) ||
           (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
           cVar1 == '.')) ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == '(')) ||
         ((cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == ')' ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == '\"')))) {
        local_90 = StringPiece::substr((StringPiece *)local_50,(long)iVar5,(long)i - (long)iVar5);
        if (*(long *)(local_60 + 0x10) == 0) {
          uVar3 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined1 **)path_local.length_ != local_58) {
            operator_delete(*(undefined1 **)path_local.length_);
          }
          _Unwind_Resume(uVar3);
        }
        (**(code **)(local_60 + 0x18))(local_80,local_60,&local_90);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        if (i < path_local.ptr_) {
          StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        iVar5 = (int)i + 1;
      }
      if ((i < path_local.ptr_) &&
         (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
         cVar1 == '\"')) {
        bVar4 = true;
      }
    }
    i = i + 1;
  } while (i <= path_local.ptr_);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertFieldMaskPath(const StringPiece path,
                                 ConverterCallback converter) {
  std::string result;
  result.reserve(path.size() << 1);

  bool is_quoted = false;
  bool is_escaping = false;
  int current_segment_start = 0;

  // Loops until 1 passed the end of the input to make handling the last
  // segment easier.
  for (size_t i = 0; i <= path.size(); ++i) {
    // Outputs quoted string as-is.
    if (is_quoted) {
      if (i == path.size()) {
        break;
      }
      result.push_back(path[i]);
      if (is_escaping) {
        is_escaping = false;
      } else if (path[i] == '\\') {
        is_escaping = true;
      } else if (path[i] == '\"') {
        current_segment_start = i + 1;
        is_quoted = false;
      }
      continue;
    }
    if (i == path.size() || path[i] == '.' || path[i] == '(' ||
        path[i] == ')' || path[i] == '\"') {
      result += converter(
          path.substr(current_segment_start, i - current_segment_start));
      if (i < path.size()) {
        result.push_back(path[i]);
      }
      current_segment_start = i + 1;
    }
    if (i < path.size() && path[i] == '\"') {
      is_quoted = true;
    }
  }
  return result;
}